

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::create_global_symtab_lookup_table(CVmImageLoader *this)

{
  vm_obj_id_t vVar1;
  int iVar2;
  CVmObject *this_00;
  vm_val_t *this_01;
  vm_runtime_sym *key;
  size_t in_RDI;
  vm_val_t str;
  vm_runtime_sym *sym;
  CVmObjLookupTable *lookup;
  uint in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((*(long *)(in_RDI + 0x60) != 0) && (*(int *)(in_RDI + 0x70) == 0)) {
    CVmRuntimeSymbols::get_sym_count(*(CVmRuntimeSymbols **)(in_RDI + 0x60));
    vVar1 = CVmObjLookupTable::create((int)(in_RDI >> 0x20),(uint)in_RDI,in_stack_ffffffffffffffcc);
    *(vm_obj_id_t *)(in_RDI + 0x70) = vVar1;
    this_00 = vm_objp(0);
    this_01 = CVmStack::push();
    vm_val_t::set_obj(this_01,*(vm_obj_id_t *)(in_RDI + 0x70));
    for (key = CVmRuntimeSymbols::get_head(*(CVmRuntimeSymbols **)(in_RDI + 0x60));
        key != (vm_runtime_sym *)0x0; key = key->nxt) {
      if (((key->val).typ != VM_OBJ) || (iVar2 = CVmObjIntClsMod::is_intcls_mod_obj(0), iVar2 == 0))
      {
        vVar1 = CVmObjString::create(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,in_RDI);
        vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffd8,vVar1);
        CVmObjLookupTable::add_entry
                  ((CVmObjLookupTable *)this_00,(vm_val_t *)key,
                   (vm_val_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      }
    }
    CVmStack::discard();
  }
  return;
}

Assistant:

void CVmImageLoader::create_global_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime symbol table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_symtab_ == 0)
        return;

    /* 
     *   if we already have a reflection symbol table, there's no need to
     *   create another 
     */
    if (reflection_symtab_ != VM_INVALID_OBJ)
        return;
    
    /* create a LookupTable to hold the symbols */
    reflection_symtab_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_symtab_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_symtab_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_symtab_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_symtab_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;

        /* 
         *   skip intrinsic class modifier objects (for the same reason we
         *   filter these out of firstObj/nextObj iterations: they're not
         *   meaningful objects as far as the program is concerned, so
         *   there's no reason for the program to see them) 
         */
        if (sym->val.typ == VM_OBJ
            && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ sym->val.val.obj))
        {
            /* it's an intrinsic class modifier - skip it */
            continue;
        }

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* 
         *   add it to the lookup table - the symbol string is the key, and
         *   the symbol's value is the lookup entry value 
         */
        lookup->add_entry(vmg_ &str, &sym->val);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}